

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

void RigidBodyDynamics::CalcConstraintsVelocityError
               (Model *model,VectorNd *Q,VectorNd *QDot,ConstraintSet *CS,VectorNd *err,
               bool update_kinematics)

{
  long *plVar1;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  
  CalcConstraintsJacobian(model,Q,CS,(MatrixNd *)(CS + 0x198),update_kinematics);
  lVar3 = *(long *)(CS + 200);
  if (*(long *)(CS + 0xd0) != lVar3) {
    uVar4 = 0;
    uVar5 = 1;
    do {
      plVar1 = *(long **)(lVar3 + uVar4 * 0x10);
      (**(code **)(*plVar1 + 0x20))
                (0,plVar1,model,Q,QDot,CS + 0x198,err,CS + 0x620,update_kinematics);
      lVar3 = *(long *)(CS + 200);
      bVar2 = uVar5 < (ulong)(*(long *)(CS + 0xd0) - lVar3 >> 4);
      uVar4 = uVar5;
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (bVar2);
  }
  return;
}

Assistant:

RBDL_DLLAPI
void CalcConstraintsVelocityError (
  Model& model,
  const Math::VectorNd &Q,
  const Math::VectorNd &QDot,
  ConstraintSet &CS,
  Math::VectorNd& err,
  bool update_kinematics
)
{


  CalcConstraintsJacobian (model, Q, CS, CS.G, update_kinematics);

  for(unsigned int i=0; i<CS.constraints.size(); ++i) {
    CS.constraints[i]->calcVelocityError(model,0,Q,QDot,CS.G,err,CS.cache,
                                         update_kinematics);
  }

}